

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void duckdb::ArrowTypeExtensionSet::Initialize(DBConfig *config)

{
  allocator local_36b;
  allocator local_36a;
  allocator local_369;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_368;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_358;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_348;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_338;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_328;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_318;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_308;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2f8;
  ArrowTypeExtension local_2e8;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  ::std::__cxx11::string::string((string *)&local_28,"arrow.uuid",&local_36b);
  ::std::__cxx11::string::string((string *)&local_48,"w:16",&local_36a);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_2f8);
  ArrowTypeExtension::ArrowTypeExtension(&local_2e8,&local_28,&local_48,&local_2f8);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::__cxx11::string::string((string *)&local_68,"arrow.bool8",&local_36b);
  ::std::__cxx11::string::string((string *)&local_88,"c",&local_36a);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&,duckdb::LogicalTypeId_const&,void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long),void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long)>
            ((LogicalTypeId *)&local_308,&LogicalType::BOOLEAN,
             (_func_void_ClientContext_ptr_Vector_ptr_Vector_ptr_unsigned_long *)
             &LogicalType::TINYINT,ArrowBool8::ArrowToDuck);
  ArrowTypeExtension::ArrowTypeExtension(&local_2e8,&local_68,&local_88,&local_308);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::string((string *)&local_a8,"DuckDB",&local_36b);
  ::std::__cxx11::string::string((string *)&local_c8,"hugeint",&local_36a);
  ::std::__cxx11::string::string((string *)&local_e8,"w:16",&local_369);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_318);
  ArrowTypeExtension::ArrowTypeExtension(&local_2e8,&local_a8,&local_c8,&local_e8,&local_318);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_318.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::string((string *)&local_108,"DuckDB",&local_36b);
  ::std::__cxx11::string::string((string *)&local_128,"uhugeint",&local_36a);
  ::std::__cxx11::string::string((string *)&local_148,"w:16",&local_369);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_328);
  ArrowTypeExtension::ArrowTypeExtension(&local_2e8,&local_108,&local_128,&local_148,&local_328);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::string((string *)&local_168,"DuckDB",&local_36b);
  ::std::__cxx11::string::string((string *)&local_188,"time_tz",&local_36a);
  ::std::__cxx11::string::string((string *)&local_1a8,"w:8",&local_369);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_338);
  ArrowTypeExtension::ArrowTypeExtension(&local_2e8,&local_168,&local_188,&local_1a8,&local_338);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_338.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::__cxx11::string::~string((string *)&local_168);
  ::std::__cxx11::string::string((string *)&local_1c8,"arrow.json",&local_36b);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_348);
  ArrowTypeExtension::ArrowTypeExtension
            (&local_2e8,&local_1c8,ArrowJson::PopulateSchema,ArrowJson::GetType,&local_348);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_348.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::string((string *)&local_1e8,"DuckDB",&local_36b);
  ::std::__cxx11::string::string((string *)&local_208,"bit",&local_36a);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_358);
  ArrowTypeExtension::ArrowTypeExtension
            (&local_2e8,&local_1e8,&local_208,ArrowBit::PopulateSchema,ArrowBit::GetType,&local_358,
             (cast_arrow_duck_t)0x0,(cast_duck_arrow_t)0x0);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_358.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::string((string *)&local_228,"DuckDB",&local_36b);
  ::std::__cxx11::string::string((string *)&local_248,"varint",&local_36a);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalTypeId_const&>
            ((LogicalTypeId *)&local_368);
  ArrowTypeExtension::ArrowTypeExtension
            (&local_2e8,&local_228,&local_248,ArrowVarint::PopulateSchema,ArrowVarint::GetType,
             &local_368,(cast_arrow_duck_t)0x0,(cast_duck_arrow_t)0x0);
  DBConfig::RegisterArrowExtension(config,&local_2e8);
  ArrowTypeExtension::~ArrowTypeExtension(&local_2e8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.internal.
              super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

void ArrowTypeExtensionSet::Initialize(const DBConfig &config) {
	// Types that are 1:1
	config.RegisterArrowExtension({"arrow.uuid", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UUID)});
	config.RegisterArrowExtension(
	    {"arrow.bool8", "c",
	     make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BOOLEAN, LogicalType::TINYINT, ArrowBool8::ArrowToDuck,
	                                             ArrowBool8::DuckToArrow)});

	config.RegisterArrowExtension(
	    {"DuckDB", "hugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::HUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "uhugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UHUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "time_tz", "w:8", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::TIME_TZ)});

	// Types that are 1:n
	config.RegisterArrowExtension({"arrow.json", &ArrowJson::PopulateSchema, &ArrowJson::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARCHAR)});

	config.RegisterArrowExtension({"DuckDB", "bit", &ArrowBit::PopulateSchema, &ArrowBit::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BIT), nullptr, nullptr});

	config.RegisterArrowExtension({"DuckDB", "varint", &ArrowVarint::PopulateSchema, &ArrowVarint::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARINT), nullptr, nullptr});
}